

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

char * Llb_MtrVarName(Llb_Mtr_t *p,int iVar)

{
  if (iVar < p->nPis) {
    Llb_MtrVarName::Buffer._0_4_ = (uint)(byte)Llb_MtrVarName::Buffer[3] << 0x18;
    Llb_MtrVarName::Buffer[0] = 'p';
    Llb_MtrVarName::Buffer[1] = 'i';
  }
  else if (iVar < p->nPis + p->nFfs) {
    Llb_MtrVarName::Buffer._0_4_ = (uint)(byte)Llb_MtrVarName::Buffer[3] << 0x18;
    Llb_MtrVarName::Buffer[0] = 'C';
    Llb_MtrVarName::Buffer[1] = 'S';
  }
  else if (iVar < p->nRows - p->nFfs) {
    builtin_strncpy(Llb_MtrVarName::Buffer,"int",4);
  }
  else {
    Llb_MtrVarName::Buffer._0_4_ = (uint)(byte)Llb_MtrVarName::Buffer[3] << 0x18;
    Llb_MtrVarName::Buffer[0] = 'N';
    Llb_MtrVarName::Buffer[1] = 'S';
  }
  return Llb_MtrVarName::Buffer;
}

Assistant:

char * Llb_MtrVarName( Llb_Mtr_t * p, int iVar )
{
    static char Buffer[10];
    if ( iVar < p->nPis )
        strcpy( Buffer, "pi" );
    else if ( iVar < p->nPis + p->nFfs )
        strcpy( Buffer, "CS" );
    else if ( iVar >= p->nRows - p->nFfs )
        strcpy( Buffer, "NS" );
    else 
        strcpy( Buffer, "int" );
    return Buffer;
}